

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O1

void __thiscall BVFixed::Or(BVFixed *this,BVFixed *bv)

{
  ulong *puVar1;
  code *pcVar2;
  bool bVar3;
  BVIndex BVar4;
  undefined4 *puVar5;
  long lVar6;
  
  AssertBV(this,bv);
  if (this->len != bv->len) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                       ,0x45,"(this->len == bv2->len)",
                       "Fatal: The 2 bitvectors should have had the same length.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  WordCount(this->len);
  lVar6 = 8;
  do {
    puVar1 = (ulong *)((long)&this->len + lVar6);
    *puVar1 = *puVar1 | *(ulong *)((long)&bv->len + lVar6);
    BVar4 = WordCount(this->len);
    lVar6 = lVar6 + 8;
  } while ((BVFixed *)(puVar1 + 1) != this + (ulong)BVar4 + 1);
  return;
}

Assistant:

void
BVFixed::Or(const BVFixed*bv)
{
    AssertBV(bv);
    this->for_each(bv, &BVUnit::Or);
}